

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O3

void __thiscall Server<Client>::start(Server<Client> *this)

{
  Client cl;
  undefined1 local_81 [9];
  _Task_state<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AleksMVP[P]static_server_include_Server_h:57:17),_std::allocator<int>,_void_()>
  *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  Client local_5c;
  anon_class_16_2_37edc3c6_for__M_fn local_58;
  packaged_task<void_()> local_48;
  
  LOCK();
  (this->is_working)._M_base._M_i = true;
  UNLOCK();
  if (((this->is_working)._M_base._M_i & 1U) != 0) {
    do {
      (**this->acceptor->_vptr_IAcceptor)(&local_5c);
      local_58.this = this;
      Client::Client(&local_58.client,&local_5c);
      local_78 = (_Task_state<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_AleksMVP[P]static_server_include_Server_h:57:17),_std::allocator<int>,_void_()>
                  *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::__future_base::_Task_state<Server<Client>::start()::_lambda()_1_,std::allocator<int>,void()>,std::allocator<int>,Server<Client>::start()::_lambda()_1_,std::allocator<int>const&>
                (a_Stack_70,&local_78,(allocator<int> *)local_81,&local_58,
                 (allocator<int> *)local_81);
      local_48._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = &local_78->super__Task_state_base<void_()>;
      local_48._M_state.
      super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = a_Stack_70[0]._M_pi;
      Client::~Client(&local_58.client);
      NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
                (&(this->thread_pool).queue,&local_48);
      std::packaged_task<void_()>::~packaged_task(&local_48);
      Client::~Client(&local_5c);
    } while (((this->is_working)._M_base._M_i & 1U) != 0);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        try {
            T cl(acceptor.accept());
            std::packaged_task<void(void)> task(
                [this, client = std::move(cl)] () mutable {
                    handler.handle(std::move(client));
                }
            );
            thread_pool.push(std::move(task));
        } catch (AcceptException& ex) {
            stream << ex.what() << std::endl;
        }
    }
}